

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O2

void mpp_show_color_format(void)

{
  uint uVar1;
  long lVar2;
  
  _mpp_log_l(4,"mpi","mpp color support list:",(char *)0x0);
  for (lVar2 = 8; lVar2 != 0x178; lVar2 = lVar2 + 0x10) {
    uVar1 = *(uint *)((long)&support_list[0xf].coding_name + lVar2);
    _mpp_log_l(4,"mpi","color: id %-5d 0x%05x %s\n",(char *)0x0,(ulong)uVar1,(ulong)uVar1,
               *(undefined8 *)((long)&color_list[0].format + lVar2));
  }
  return;
}

Assistant:

void mpp_show_color_format()
{
    RK_U32 i = 0;

    mpp_log("mpp color support list:");

    for (i = 0; i < MPP_ARRAY_ELEMS(color_list); i++) {
        MppFrameFormatInfo *info = &color_list[i];
        mpp_log("color: id %-5d 0x%05x %s\n",
                info->format, info->format, info->name);
    }
}